

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

char * __thiscall
google::protobuf::EnumValueDescriptorProto::_InternalParse
          (EnumValueDescriptorProto *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  string *s;
  uint64 uVar2;
  EnumValueOptions *msg;
  uint uVar3;
  uint uVar4;
  char cVar5;
  uint32 tag;
  char *local_40;
  uint local_34;
  
  uVar4 = 0;
  local_40 = ptr;
  do {
    while( true ) {
      bVar1 = internal::ParseContext::Done(ctx,&local_40);
      if (bVar1) goto LAB_002bc974;
      local_40 = internal::ReadTag(local_40,&local_34,0);
      if (local_40 == (char *)0x0) goto LAB_002bc96b;
      uVar3 = local_34 >> 3;
      cVar5 = (char)local_34;
      if (uVar3 != 3) break;
      if (cVar5 != '\x1a') goto LAB_002bc941;
      msg = _internal_mutable_options(this);
      local_40 = internal::ParseContext::ParseMessage<google::protobuf::EnumValueOptions>
                           (ctx,msg,local_40);
LAB_002bc95d:
      if (local_40 == (char *)0x0) goto LAB_002bc96b;
    }
    if (uVar3 != 2) {
      if ((uVar3 == 1) && (cVar5 == '\n')) {
        s = _internal_mutable_name_abi_cxx11_(this);
        local_40 = internal::InlineGreedyStringParser(s,local_40,ctx);
        goto LAB_002bc95d;
      }
LAB_002bc941:
      if ((local_34 != 0) && ((local_34 & 7) != 4)) {
        local_40 = internal::UnknownFieldParse(local_34,&this->_internal_metadata_,local_40,ctx);
        goto LAB_002bc95d;
      }
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_34 - 1;
      goto LAB_002bc974;
    }
    if (cVar5 != '\x10') goto LAB_002bc941;
    uVar4 = 4;
    uVar2 = internal::ReadVarint(&local_40);
    this->number_ = (int32)uVar2;
  } while (local_40 != (char *)0x0);
LAB_002bc96b:
  local_40 = (char *)0x0;
LAB_002bc974:
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar4;
  return local_40;
}

Assistant:

const char* EnumValueDescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "google.protobuf.EnumValueDescriptorProto.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional int32 number = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          _Internal::set_has_number(&has_bits);
          number_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.EnumValueOptions options = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}